

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O0

void slang::ast::SFormat::formatPattern
               (string *result,ConstantValue *arg,Type *type,FormatOptions *options,
               bool isStringLiteral)

{
  byte in_R8B;
  TypeVisitor visitor;
  FormatBuffer *this;
  TypeVisitor *in_stack_fffffffffffffd80;
  TypeVisitor *in_stack_fffffffffffffd88;
  Symbol *in_stack_fffffffffffffd90;
  FormatBuffer local_250;
  byte local_21;
  
  local_21 = in_R8B & 1;
  this = &local_250;
  TypeVisitor::TypeVisitor
            (in_stack_fffffffffffffd80,SUB81((ulong)this >> 0x38,0),SUB81((ulong)this >> 0x30,0));
  Symbol::visit<slang::ast::SFormat::TypeVisitor&,slang::ConstantValue_const&>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (ConstantValue *)in_stack_fffffffffffffd80);
  FormatBuffer::str_abi_cxx11_(this);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd80);
  TypeVisitor::~TypeVisitor((TypeVisitor *)0x6cdd5f);
  return;
}

Assistant:

void formatPattern(std::string& result, const ConstantValue& arg, const Type& type,
                   const FormatOptions& options, bool isStringLiteral) {
    TypeVisitor visitor(options.zeroPad, isStringLiteral);
    type.visit(visitor, arg);
    result += visitor.buffer.str();
}